

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_address.cpp
# Opt level: O0

bool miniros::network::fillAddress(sockaddr_in *my_addr,NetAddress *address)

{
  uint16_t uVar1;
  char *pcVar2;
  size_t __size;
  void *__dest;
  Type *in_RSI;
  ushort *in_RDI;
  sockaddr_in *outAddr;
  size_t size;
  char ipBuffer [255];
  NetAddress *in_stack_fffffffffffffee0;
  char local_118 [256];
  Type *local_18;
  ushort *local_10;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  NetAddress::reset(in_stack_fffffffffffffee0);
  if (*local_10 == 2) {
    *local_18 = AddressIPv4;
    uVar1 = ntohs(local_10[1]);
    local_18[10] = (uint)uVar1;
  }
  else {
    if (*local_10 != 10) {
      *local_18 = AddressInvalid;
      return false;
    }
    *local_18 = AddressIPv6;
    uVar1 = ntohs(local_10[1]);
    local_18[10] = (uint)uVar1;
  }
  pcVar2 = inet_ntop((uint)*local_10,local_10 + 2,local_118,0xff);
  if (pcVar2 != (char *)0x0) {
    std::__cxx11::string::operator=((string *)(local_18 + 2),local_118);
    __size = getAddressSize(*local_18);
    __dest = malloc(__size);
    *(void **)(local_18 + 0xc) = __dest;
    memcpy(__dest,local_10,__size);
  }
  else {
    local_18[10] = AddressInvalid;
  }
  return pcVar2 != (char *)0x0;
}

Assistant:

bool fillAddress(const sockaddr_in& my_addr, NetAddress& address)
{
  address.reset();

  if (my_addr.sin_family == AF_INET) {
    address.type = NetAddress::AddressIPv4;
    address.port = ntohs(my_addr.sin_port);
  } else if (my_addr.sin_family == AF_INET6) {
    address.type = NetAddress::AddressIPv6;
    address.port = ntohs(my_addr.sin_port);
  } else {
    address.type = NetAddress::AddressInvalid;
    return false;
  }

  char ipBuffer[255];
  if (!inet_ntop(my_addr.sin_family, &my_addr.sin_addr, ipBuffer, sizeof(ipBuffer))) {
    address.port = 0;
    return false;
  }
  address.address = ipBuffer;

  size_t size = getAddressSize(address.type);
  sockaddr_in* outAddr = static_cast<sockaddr_in*>(malloc(size));
  address.rawAddress = outAddr;
  memcpy(outAddr, &my_addr, size);
  return true;
}